

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::TestProperty::TestProperty(TestProperty *this,string *a_key,string *a_value)

{
  string *a_value_local;
  string *a_key_local;
  TestProperty *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)a_key);
  std::__cxx11::string::string((string *)&this->value_,(string *)a_value);
  return;
}

Assistant:

TestProperty(const std::string& a_key, const std::string& a_value)
      : key_(a_key), value_(a_value) {}